

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawtransaction_util.cpp
# Opt level: O0

CMutableTransaction *
ConstructTransaction(UniValue *inputs_in,UniValue *outputs_in,UniValue *locktime,optional<bool> rbf)

{
  long lVar1;
  undefined1 uVar2;
  bool bVar3;
  undefined8 uVar4;
  bool *pbVar5;
  size_type sVar6;
  UniValue *in_RDI;
  long in_FS_OFFSET;
  _Optional_payload_base<bool> in_stack_0000000e;
  int64_t nLockTime;
  CMutableTransaction *rawTx;
  CTransaction *in_stack_fffffffffffffe88;
  optional<bool> *in_stack_fffffffffffffe98;
  CTransaction *in_stack_fffffffffffffea0;
  byte local_141;
  CMutableTransaction *in_stack_fffffffffffffec0;
  CTransaction *in_stack_fffffffffffffec8;
  string *message;
  char *in_stack_fffffffffffffed0;
  UniValue *outputs_in_00;
  undefined4 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeed;
  undefined1 in_stack_fffffffffffffeee;
  byte bVar7;
  undefined1 in_stack_fffffffffffffeef;
  string local_cb [4];
  UniValue *in_stack_ffffffffffffffb8;
  CMutableTransaction *in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  outputs_in_00 = in_RDI;
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)in_stack_fffffffffffffe88);
  uVar2 = UniValue::isNull((UniValue *)in_stack_fffffffffffffe88);
  if (!(bool)uVar2) {
    in_stack_fffffffffffffed0 =
         (char *)UniValue::getInt<long>
                           ((UniValue *)
                            CONCAT17(in_stack_fffffffffffffeef,
                                     CONCAT16(in_stack_fffffffffffffeee,
                                              CONCAT15(in_stack_fffffffffffffeed,
                                                       CONCAT14(uVar2,in_stack_fffffffffffffee8)))))
    ;
    if (((long)in_stack_fffffffffffffed0 < 0) || (0xffffffff < (long)in_stack_fffffffffffffed0)) {
      uVar4 = __cxa_allocate_exception(0x58);
      message = local_cb;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                 in_stack_fffffffffffffed0,(allocator<char> *)message);
      JSONRPCError((int)((ulong)in_RDI >> 0x20),message);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(uVar4,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_00e3f715;
    }
    *(int *)((long)&(in_RDI->keys).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish + 4) = (int)in_stack_fffffffffffffed0
    ;
  }
  AddInputs(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(optional<bool>)in_stack_0000000e);
  AddOutputs((CMutableTransaction *)
             CONCAT17(in_stack_fffffffffffffeef,
                      CONCAT16(in_stack_fffffffffffffeee,
                               CONCAT15(in_stack_fffffffffffffeed,
                                        CONCAT14(uVar2,in_stack_fffffffffffffee8)))),outputs_in_00);
  bVar3 = std::optional<bool>::has_value((optional<bool> *)in_stack_fffffffffffffe88);
  bVar7 = 0;
  local_141 = 0;
  if (bVar3) {
    pbVar5 = std::optional<bool>::value(in_stack_fffffffffffffe98);
    local_141 = 0;
    if ((*pbVar5 & 1U) != 0) {
      sVar6 = std::vector<CTxIn,_std::allocator<CTxIn>_>::size(&in_stack_fffffffffffffe88->vin);
      local_141 = 0;
      if (sVar6 != 0) {
        CTransaction::CTransaction(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
        bVar7 = 1;
        bVar3 = SignalsOptInRBF(in_stack_fffffffffffffea0);
        local_141 = bVar3 ^ 0xff;
      }
    }
  }
  if ((bVar7 & 1) != 0) {
    CTransaction::~CTransaction(in_stack_fffffffffffffe88);
  }
  if ((local_141 & 1) == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return (CMutableTransaction *)outputs_in_00;
    }
  }
  else {
    uVar4 = __cxa_allocate_exception(0x58);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
               in_stack_fffffffffffffed0,(allocator<char> *)in_stack_fffffffffffffec8);
    JSONRPCError((int)((ulong)in_RDI >> 0x20),(string *)in_stack_fffffffffffffec8);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(uVar4,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
LAB_00e3f715:
  __stack_chk_fail();
}

Assistant:

CMutableTransaction ConstructTransaction(const UniValue& inputs_in, const UniValue& outputs_in, const UniValue& locktime, std::optional<bool> rbf)
{
    CMutableTransaction rawTx;

    if (!locktime.isNull()) {
        int64_t nLockTime = locktime.getInt<int64_t>();
        if (nLockTime < 0 || nLockTime > LOCKTIME_MAX)
            throw JSONRPCError(RPC_INVALID_PARAMETER, "Invalid parameter, locktime out of range");
        rawTx.nLockTime = nLockTime;
    }

    AddInputs(rawTx, inputs_in, rbf);
    AddOutputs(rawTx, outputs_in);

    if (rbf.has_value() && rbf.value() && rawTx.vin.size() > 0 && !SignalsOptInRBF(CTransaction(rawTx))) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, "Invalid parameter combination: Sequence number(s) contradict replaceable option");
    }

    return rawTx;
}